

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

void __thiscall DSBarInfo::ShowPop(DSBarInfo *this,int popnum)

{
  int __oflag;
  char *__file;
  int popnum_local;
  DSBarInfo *this_local;
  
  __file = (char *)(ulong)(uint)popnum;
  DBaseStatusBar::ShowPop(&this->super_DBaseStatusBar,popnum);
  if (popnum == this->currentPopup) {
    this->pendingPopup = 0;
  }
  else {
    this->pendingPopup = popnum;
  }
  if (this->currentPopup == 0) {
    this->currentPopup = this->pendingPopup;
    this->pendingPopup = 0;
    if (this->currentPopup != 0) {
      Popup::open(this->script->popups + (this->currentPopup + -1),__file,__oflag);
    }
  }
  else {
    Popup::close(this->script->popups + (this->currentPopup + -1),(int)__file);
  }
  return;
}

Assistant:

void ShowPop(int popnum)
	{
		DBaseStatusBar::ShowPop(popnum);
		if(popnum != currentPopup)
		{
			pendingPopup = popnum;
		}
		else
			pendingPopup = POP_None;
		if(currentPopup != POP_None)
			script->popups[currentPopup-1].close();
		else
		{
			currentPopup = pendingPopup;
			pendingPopup = POP_None;
			if(currentPopup != POP_None)
				script->popups[currentPopup-1].open();
		}
	}